

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmValue __thiscall
cmTargetInternals::GetFileSetDirectories
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,string_view fileSetType)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  cmFileSet *pcVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view fileSetType_local;
  string local_48;
  
  fileSetType_local._M_str = fileSetType._M_str;
  fileSetType_local._M_len = fileSetType._M_len;
  pcVar3 = cmTarget::GetFileSet(self,fileSetName);
  if (pcVar3 != (cmFileSet *)0x0) {
    __x._M_str = (pcVar3->Type)._M_dataplus._M_p;
    __x._M_len = (pcVar3->Type)._M_string_length;
    bVar1 = std::operator!=(__x,fileSetType);
    if (!bVar1) {
      if ((GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
           ::output_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                                       ::output_abi_cxx11_), iVar2 != 0)) {
        GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
        ::output_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                       ::output_abi_cxx11_.field_2;
        GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
        ::output_abi_cxx11_._M_string_length = 0;
        GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
        ::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                      ::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                             ::output_abi_cxx11_);
      }
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&local_48,&pcVar3->DirectoryEntries);
      std::__cxx11::string::operator=
                ((string *)
                 &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                  ::output_abi_cxx11_,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      return (cmValue)&GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                       ::output_abi_cxx11_;
    }
    this_00 = this->Makefile;
    cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[19],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
              (&local_48,(char (*) [11])"File set \"",fileSetName,
               (char (*) [19])"\" is not of type \"",&fileSetType_local,(char (*) [3])0x6c41d8);
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmTargetInternals::GetFileSetDirectories(
  cmTarget const* self, std::string const& fileSetName,
  cm::string_view fileSetType) const
{
  auto const* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    return nullptr;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return nullptr;
  }
  static std::string output;
  output = cmList::to_string(fileSet->GetDirectoryEntries());
  return cmValue(output);
}